

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Isd.cpp
# Opt level: O3

void __thiscall csm::Nitf21Isd::~Nitf21Isd(Nitf21Isd *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_NitfIsd).super_Isd._vptr_Isd = (_func_int **)&PTR__Nitf21Isd_001246b8;
  std::vector<csm::Image,_std::allocator<csm::Image>_>::~vector(&(this->super_NitfIsd).theImages);
  std::vector<csm::Des,_std::allocator<csm::Des>_>::~vector(&(this->super_NitfIsd).theFileDess);
  std::vector<csm::Tre,_std::allocator<csm::Tre>_>::~vector(&(this->super_NitfIsd).theFileTres);
  pcVar2 = (this->super_NitfIsd).theFileHeader._M_dataplus._M_p;
  paVar1 = &(this->super_NitfIsd).theFileHeader.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Isd::~Isd((Isd *)this);
  return;
}

Assistant:

csm::NitfIsd::~NitfIsd() {}